

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O2

tuple<void_*,_unsigned_int> __thiscall MemPool::writeRecord(MemPool *this,uint recordSize)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  uint uVar6;
  _Head_base<0UL,_void_*,_false> in_RDX;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  MemPool *this_00;
  tuple<void_*,_unsigned_int> tVar7;
  
  this_00 = (MemPool *)CONCAT44(in_register_00000034,recordSize);
  uVar6 = (uint)in_RDX._M_head_impl;
  uVar3 = this_00->blkSize;
  if ((uVar3 < this_00->curBlkUsed + uVar6) || (this_00->numAllocBlks == 0)) {
    bVar2 = allocBlk(this_00);
    if (!bVar2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar5 = "Unable to reserve space as no free space in blocks or no blocks can be allocated";
      goto LAB_0011836f;
    }
    uVar3 = this_00->blkSize;
    in_RDX._M_head_impl = extraout_RDX;
  }
  if (uVar6 <= uVar3) {
    uVar1 = this_00->curBlkUsed;
    *(uint *)&this->memPoolPtr = uVar1;
    this->blkPtr = this_00->blkPtr;
    this_00->memPoolUsedRecords = this_00->memPoolUsedRecords + uVar6;
    this_00->curBlkUsed = uVar1 + uVar6;
    tVar7.super__Tuple_impl<0UL,_void_*,_unsigned_int>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = in_RDX._M_head_impl;
    tVar7.super__Tuple_impl<0UL,_void_*,_unsigned_int>._0_8_ = this;
    return (tuple<void_*,_unsigned_int>)tVar7.super__Tuple_impl<0UL,_void_*,_unsigned_int>;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar5 = "Unable to reserve space as record size is greater than the block size";
LAB_0011836f:
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

tuple<void * , uint> MemPool::writeRecord(uint recordSize) {

    if(blkSize < (curBlkUsed + recordSize) or numAllocBlks == 0){
        if (!allocBlk())
            throw "Unable to reserve space as no free space in blocks or no blocks can be allocated";
    }

    if (blkSize < recordSize) {
        throw "Unable to reserve space as record size is greater than the block size";
    }

    // Create a tuple for the address where the record is written <block address, relative offset>
    // The record can be accessed at the address (block address + relative offset)

    // void * pointer stores the address of the block, but in order to perform pointer arithmetic, this further needs
    // to be cast into uint or uchar pointer
    tuple<void * , uint> recordAddress(blkPtr, curBlkUsed);

    memPoolUsedRecords+=recordSize;
    curBlkUsed+=recordSize;

    return recordAddress;
}